

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

bool ON_XMLNodePrivate::RecoverProperty(ON_wString *tag,int equalSign,ON_wString *sProp)

{
  ulong uVar1;
  bool bVar2;
  wchar_t wVar3;
  wchar_t *tag_name;
  int start_index;
  int iVar4;
  ON_wString sValue;
  ON_wString sName;
  ON_wString OStack_68;
  ON_wString local_60;
  ON_wString local_58;
  ON_wString local_50;
  ON_wString local_48;
  ulong local_40;
  ON_wString *local_38;
  
  local_38 = sProp;
  wVar3 = ON_wString::operator[](tag,equalSign);
  ON_REMOVE_ASAP_AssertEx
            ((uint)(wVar3 == L'='),
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
             ,0x956,"","tag[equalSign] == L\'=\' is false");
  ON_wString::ON_wString(&local_60);
  local_40 = (ulong)(uint)equalSign;
  if (1 < equalSign) {
    iVar4 = equalSign + 1;
    do {
      wVar3 = ON_wString::operator[](tag,iVar4 + -2);
      if (wVar3 == L' ') break;
      wVar3 = ON_wString::operator[](tag,iVar4 + -2);
      ON_wString::ON_wString(&local_58,wVar3,1);
      ON_wString::operator+(&OStack_68,&local_58);
      ON_wString::operator=(&local_60,&OStack_68);
      ON_wString::~ON_wString(&OStack_68);
      ON_wString::~ON_wString(&local_58);
      iVar4 = iVar4 + -1;
    } while (2 < iVar4);
  }
  tag_name = ON_wString::operator_cast_to_wchar_t_(&local_60);
  uVar1 = local_40;
  bVar2 = IsValidXMLNameWithDebugging(tag_name);
  if (bVar2) {
    bVar2 = ON_wString::IsEmpty(&local_60);
    if (!bVar2) {
      iVar4 = ON_wString::Length(tag);
      start_index = (int)uVar1 + 2;
      if (start_index < iVar4) {
        wVar3 = ON_wString::operator[](tag,(int)uVar1 + 1);
        if (wVar3 == L'\"') {
          iVar4 = ON_wString::Find(tag,L'\"',start_index);
          bVar2 = iVar4 != -1;
          if (bVar2) {
            ON_wString::Mid(&OStack_68,(int)tag,start_index);
            EncodeXML(&OStack_68);
            ON_wString::operator+(&local_50,(wchar_t *)&local_60);
            ON_wString::operator+(&local_48,&local_50);
            ON_wString::operator+(&local_58,(wchar_t *)&local_48);
            ON_wString::operator=(local_38,&local_58);
            ON_wString::~ON_wString(&local_58);
            ON_wString::~ON_wString(&local_48);
            ON_wString::~ON_wString(&local_50);
            ON_wString::~ON_wString(&OStack_68);
            bVar2 = true;
          }
          goto LAB_00691cda;
        }
      }
    }
  }
  bVar2 = false;
LAB_00691cda:
  ON_wString::~ON_wString(&local_60);
  return bVar2;
}

Assistant:

bool ON_XMLNodePrivate::RecoverProperty(const ON_wString& tag, int equalSign, ON_wString& sProp) // Static.
{
  // Move left, looking for a space and ensuring every character is a valid name char.
  ON_ASSERT(tag[equalSign] == L'=');

  ON_wString sName;
  int leftScan = equalSign - 1;
  while (leftScan > 0 && tag[leftScan] != L' ')
  {
    sName = ON_wString(tag[leftScan--]) + sName;
  }

  if (!IsValidXMLNameWithDebugging(sName) || sName.IsEmpty())
    return false;

  // Now try to recover the value.
  const int start = equalSign + 2;
  if (start >= tag.Length())
    return false;

  if (tag[equalSign + 1] != L'\"')
    return false;

  const int secondQuote = tag.Find(L'\"', start);
  if (secondQuote == -1)
    return false;

  ON_wString sValue = tag.Mid(start, secondQuote - start);
  EncodeXML(sValue);

  sProp = sName + L"=\"" + sValue + L"\"";

  return true;
}